

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::printTestRunTotals(ostream *stream,ColourImpl *streamColour,Totals *totals)

{
  Counts *this;
  bool bVar1;
  ostream *poVar2;
  uint64_t count;
  StringRef label;
  StringRef label_00;
  size_t in_stack_fffffffffffffeb8;
  allocator<char> local_139;
  vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
  columns;
  SummaryColumn local_118;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_118.m_suffix._M_dataplus._M_p = (pointer)streamColour;
  if ((totals->testCases).failed + (totals->testCases).passed + (totals->testCases).failedButOk +
      (totals->testCases).skipped == 0) {
    local_118.m_suffix._M_string_length = CONCAT35(local_118.m_suffix._M_string_length._5_3_,0x16);
    ColourImpl::ColourGuard::engageImpl((ColourGuard *)&local_118,stream);
    std::operator<<(stream,"No tests ran\n");
    ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&local_118);
  }
  else {
    this = &totals->testCases;
    count = (totals->assertions).failed + (totals->assertions).passed +
            (totals->assertions).failedButOk;
    if (((totals->assertions).skipped + count != 0) && (bVar1 = Counts::allPassed(this), bVar1)) {
      local_118.m_suffix._M_string_length = CONCAT35(local_118.m_suffix._M_string_length._5_3_,0x13)
      ;
      ColourImpl::ColourGuard::engageImpl((ColourGuard *)&local_118,stream);
      std::operator<<(stream,"All tests passed");
      ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&local_118);
      poVar2 = std::operator<<(stream," (");
      local_118.m_suffix._M_dataplus._M_p = (pointer)(totals->assertions).passed;
      local_118.m_suffix._M_string_length = 0x25c67d;
      local_118.m_suffix.field_2._M_allocated_capacity = 9;
      operator<<(poVar2,(pluralise *)&local_118);
      poVar2 = std::operator<<(poVar2," in ");
      columns.
      super__Vector_base<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x25c654;
      columns.
      super__Vector_base<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)(totals->testCases).passed;
      columns.
      super__Vector_base<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x9;
      operator<<(poVar2,(pluralise *)&columns);
      poVar2 = std::operator<<(poVar2,')');
      std::operator<<(poVar2,'\n');
      return;
    }
    columns.
    super__Vector_base<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    columns.
    super__Vector_base<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    columns.
    super__Vector_base<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_139);
    anon_unknown_26::SummaryColumn::SummaryColumn(&local_118,&local_50,None);
    anon_unknown_26::SummaryColumn::addRow
              (&local_118,
               (totals->testCases).skipped + (totals->testCases).failed +
               (totals->testCases).failedButOk + this->passed);
    anon_unknown_26::SummaryColumn::addRow(&local_118,count);
    std::
    vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
    ::push_back(&columns,&local_118);
    anon_unknown_26::SummaryColumn::~SummaryColumn(&local_118);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"passed",&local_139);
    anon_unknown_26::SummaryColumn::SummaryColumn(&local_118,&local_70,Green);
    anon_unknown_26::SummaryColumn::addRow(&local_118,this->passed);
    anon_unknown_26::SummaryColumn::addRow(&local_118,(totals->assertions).passed);
    std::
    vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
    ::push_back(&columns,&local_118);
    anon_unknown_26::SummaryColumn::~SummaryColumn(&local_118);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"failed",&local_139);
    anon_unknown_26::SummaryColumn::SummaryColumn(&local_118,&local_90,BrightRed);
    anon_unknown_26::SummaryColumn::addRow(&local_118,(totals->testCases).failed);
    anon_unknown_26::SummaryColumn::addRow(&local_118,(totals->assertions).failed);
    std::
    vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
    ::push_back(&columns,&local_118);
    anon_unknown_26::SummaryColumn::~SummaryColumn(&local_118);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"skipped",&local_139);
    anon_unknown_26::SummaryColumn::SummaryColumn(&local_118,&local_b0,FileName);
    anon_unknown_26::SummaryColumn::addRow(&local_118,(totals->testCases).skipped);
    anon_unknown_26::SummaryColumn::addRow(&local_118,0);
    std::
    vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
    ::push_back(&columns,&local_118);
    anon_unknown_26::SummaryColumn::~SummaryColumn(&local_118);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"failed as expected",&local_139);
    anon_unknown_26::SummaryColumn::SummaryColumn(&local_118,&local_d0,BrightYellow);
    anon_unknown_26::SummaryColumn::addRow(&local_118,(totals->testCases).failedButOk);
    anon_unknown_26::SummaryColumn::addRow(&local_118,(totals->assertions).failedButOk);
    std::
    vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
    ::push_back(&columns,&local_118);
    anon_unknown_26::SummaryColumn::~SummaryColumn(&local_118);
    std::__cxx11::string::~string((string *)&local_d0);
    label.m_size = (size_type)&columns;
    label.m_start = (char *)0xa;
    anon_unknown_26::printSummaryRow
              ((anon_unknown_26 *)stream,(ostream *)streamColour,(ColourImpl *)0x25b0d7,label,
               (vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                *)0x0,in_stack_fffffffffffffeb8);
    label_00.m_size = (size_type)&columns;
    label_00.m_start = (char *)0xa;
    anon_unknown_26::printSummaryRow
              ((anon_unknown_26 *)stream,(ostream *)streamColour,(ColourImpl *)"assertions",label_00
               ,(vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
                 *)0x1,in_stack_fffffffffffffeb8);
    std::
    vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
    ::~vector(&columns);
  }
  return;
}

Assistant:

void printTestRunTotals( std::ostream& stream,
                             ColourImpl& streamColour,
                             Totals const& totals ) {
        if ( totals.testCases.total() == 0 ) {
            stream << streamColour.guardColour( Colour::Warning )
                   << "No tests ran\n";
            return;
        }

        if ( totals.assertions.total() > 0 && totals.testCases.allPassed() ) {
            stream << streamColour.guardColour( Colour::ResultSuccess )
                   << "All tests passed";
            stream << " ("
                   << pluralise( totals.assertions.passed, "assertion"_sr )
                   << " in "
                   << pluralise( totals.testCases.passed, "test case"_sr )
                   << ')' << '\n';
            return;
        }

        std::vector<SummaryColumn> columns;
        // Don't include "skipped assertions" in total count
        const auto totalAssertionCount =
            totals.assertions.total() - totals.assertions.skipped;
        columns.push_back( SummaryColumn( "", Colour::None )
                               .addRow( totals.testCases.total() )
                               .addRow( totalAssertionCount ) );
        columns.push_back( SummaryColumn( "passed", Colour::Success )
                               .addRow( totals.testCases.passed )
                               .addRow( totals.assertions.passed ) );
        columns.push_back( SummaryColumn( "failed", Colour::ResultError )
                               .addRow( totals.testCases.failed )
                               .addRow( totals.assertions.failed ) );
        columns.push_back( SummaryColumn( "skipped", Colour::Skip )
                               .addRow( totals.testCases.skipped )
                               // Don't print "skipped assertions"
                               .addRow( 0 ) );
        columns.push_back(
            SummaryColumn( "failed as expected", Colour::ResultExpectedFailure )
                .addRow( totals.testCases.failedButOk )
                .addRow( totals.assertions.failedButOk ) );
        printSummaryRow( stream, streamColour, "test cases"_sr, columns, 0 );
        printSummaryRow( stream, streamColour, "assertions"_sr, columns, 1 );
    }